

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O0

UBool __thiscall
icu_63::StringCharacterIterator::operator==
          (StringCharacterIterator *this,ForwardCharacterIterator *that)

{
  bool bVar1;
  UBool UVar2;
  bool local_31;
  StringCharacterIterator *realThat;
  ForwardCharacterIterator *that_local;
  StringCharacterIterator *this_local;
  
  if (this == (StringCharacterIterator *)that) {
    this_local._7_1_ = true;
  }
  else {
    if (this == (StringCharacterIterator *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)
                       (this->super_UCharCharacterIterator).super_CharacterIterator.
                       super_ForwardCharacterIterator.super_UObject._vptr_UObject[-1],
                       (type_info *)(that->super_UObject)._vptr_UObject[-1]);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      UVar2 = UnicodeString::operator==(&this->text,(UnicodeString *)(that + 4));
      local_31 = false;
      if (((UVar2 != '\0') &&
          (local_31 = false,
          (this->super_UCharCharacterIterator).super_CharacterIterator.pos ==
          *(int *)((long)&that[1].super_UObject._vptr_UObject + 4))) &&
         (local_31 = false,
         (this->super_UCharCharacterIterator).super_CharacterIterator.begin ==
         *(int *)&that[2].super_UObject._vptr_UObject)) {
        local_31 = (this->super_UCharCharacterIterator).super_CharacterIterator.end ==
                   *(int *)((long)&that[2].super_UObject._vptr_UObject + 4);
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
StringCharacterIterator::operator==(const ForwardCharacterIterator& that) const {
    if (this == &that) {
        return TRUE;
    }

    // do not call UCharCharacterIterator::operator==()
    // because that checks for array pointer equality
    // while we compare UnicodeString objects

    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }

    StringCharacterIterator&    realThat = (StringCharacterIterator&)that;

    return text == realThat.text
        && pos == realThat.pos
        && begin == realThat.begin
        && end == realThat.end;
}